

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O3

anytype_t * anytype_from_float(anytype_t *val,int t,double f)

{
  int iVar1;
  int iVar2;
  anytype_t aVar3;
  char *__s;
  long ln;
  
  if (val == (anytype_t *)0x0) {
    return (anytype_t *)0x0;
  }
  switch(t) {
  case 2:
  case 3:
    aVar3.i = (long)f;
    goto LAB_0010d860;
  case 4:
  case 5:
    val->fl = f;
    break;
  default:
    val = (anytype_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x328,"Unknown argument type: %d\n");
    break;
  case 8:
  case 9:
    iVar1 = snprintf((char *)0x0,0,"%g");
    if (iVar1 < 0) {
      ln = 0x31d;
    }
    else {
      __s = (char *)__ckd_malloc__((ulong)(iVar1 + 1),
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                   ,800);
      val->ptr = __s;
      iVar2 = snprintf(__s,(ulong)(iVar1 + 1),"%g",f);
      if (iVar2 == iVar1) {
        return val;
      }
      ln = 0x322;
    }
    val = (anytype_t *)0x0;
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                   ,ln,"snprintf() failed");
    break;
  case 0x10:
  case 0x11:
    aVar3._0_4_ = -(uint)(f != 0.0) & 1;
    aVar3.i._4_4_ = 0;
LAB_0010d860:
    *val = aVar3;
  }
  return val;
}

Assistant:

anytype_t *
anytype_from_float(anytype_t *val, int t, double f)
{
    if (val == NULL)
        return NULL;
    switch (t) {
    case ARG_INTEGER:
    case REQARG_INTEGER:
        val->i = (long)f;
        break;
    case ARG_FLOATING:
    case REQARG_FLOATING:
        val->fl = f;
        break;
    case ARG_BOOLEAN:
    case REQARG_BOOLEAN:
        val->i = (f != 0.0);
        break;
    case ARG_STRING:
    case REQARG_STRING: {
        int len = snprintf(NULL, 0, "%g", f);
        if (len < 0) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        val->ptr = ckd_malloc(len + 1);
        if (snprintf(val->ptr, len + 1, "%g", f) != len) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        break;
    }
    default:
        E_ERROR("Unknown argument type: %d\n", t);
        return NULL;
    }
    return val;
}